

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawPlane
          (cbtIDebugDraw *this,cbtVector3 *planeNormal,cbtScalar planeConst,cbtTransform *transform,
          cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  fVar1 = planeNormal->m_floats[2];
  fVar2 = planeNormal->m_floats[0];
  fVar3 = planeNormal->m_floats[1];
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar12);
  if (auVar12._0_4_ <= 0.70710677) {
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                              ZEXT416((uint)fVar2));
    auVar12 = vsqrtss_avx(auVar16,auVar16);
    fVar23 = 1.0 / auVar12._0_4_;
    fVar21 = fVar23 * fVar2;
    fVar22 = fVar23 * auVar16._0_4_;
    fVar19 = 0.0;
    fVar20 = fVar23 * -fVar3 * fVar1;
    fVar24 = fVar23 * -fVar3 * 100.0;
    fVar23 = fVar21 * -fVar1;
  }
  else {
    fVar24 = 0.0;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar3),
                              ZEXT416((uint)fVar3));
    auVar12 = vsqrtss_avx(auVar16,auVar16);
    fVar19 = 1.0 / auVar12._0_4_;
    fVar21 = fVar19 * -fVar1;
    fVar23 = auVar16._0_4_ * fVar19;
    fVar20 = fVar3 * fVar19 * -fVar2;
    fVar19 = fVar3 * fVar19 * 100.0;
    fVar22 = fVar2 * fVar21;
  }
  fVar1 = fVar1 * planeConst;
  fVar3 = fVar3 * planeConst;
  fVar2 = fVar2 * planeConst;
  fVar4 = (transform->m_basis).m_el[2].m_floats[1];
  fVar5 = fVar24 + fVar2;
  fVar24 = fVar2 - fVar24;
  fVar6 = fVar19 + fVar1;
  fVar19 = fVar1 - fVar19;
  fVar7 = fVar2 + fVar23 * 100.0;
  fVar2 = fVar2 - fVar23 * 100.0;
  fVar8 = fVar3 + fVar21 * 100.0;
  fVar11 = fVar3 - fVar21 * 100.0;
  fVar9 = fVar3 + fVar20 * 100.0;
  fVar3 = fVar3 - fVar20 * 100.0;
  fVar21 = (transform->m_basis).m_el[1].m_floats[1];
  fVar10 = fVar1 + fVar22 * 100.0;
  fVar1 = fVar1 - fVar22 * 100.0;
  fVar23 = (transform->m_basis).m_el[0].m_floats[1];
  auVar17 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar21)),ZEXT416((uint)fVar5),auVar17);
  auVar15 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar23)),ZEXT416((uint)fVar5),auVar15);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar23)),ZEXT416((uint)fVar24),auVar15);
  auVar26 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar4)),auVar26,ZEXT416((uint)fVar5));
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar6),auVar25);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar21)),ZEXT416((uint)fVar24),auVar17);
  auVar13 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar6),auVar13);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar19),auVar13);
  auVar28 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar13 = vfmadd231ss_avx512f(auVar18,auVar28,ZEXT416((uint)fVar6));
  auVar27 = ZEXT416((uint)(transform->m_origin).m_floats[1]);
  auVar14 = vaddss_avx512f(auVar12,auVar27);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar11)),ZEXT416((uint)fVar24),auVar26);
  auVar18 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar19),auVar25);
  auVar17 = ZEXT416((uint)(transform->m_origin).m_floats[0]);
  auVar15 = vaddss_avx512f(auVar15,auVar17);
  auVar16 = vaddss_avx512f(auVar16,auVar17);
  auVar25 = ZEXT416((uint)(transform->m_origin).m_floats[2]);
  auVar17 = vaddss_avx512f(auVar13,auVar25);
  auVar13 = vfmadd231ss_avx512f(auVar12,ZEXT416((uint)fVar19),auVar28);
  auVar18 = vaddss_avx512f(auVar18,auVar27);
  auVar12 = vinsertps_avx(auVar16,auVar14,0x10);
  local_38 = vinsertps_avx(auVar12,auVar17,0x28);
  auVar12 = vinsertps_avx(auVar15,auVar18,0x10);
  auVar16 = vaddss_avx512f(auVar13,auVar25);
  local_48 = vinsertps_avx(auVar12,auVar16,0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_38,local_48,color);
  fVar21 = (transform->m_basis).m_el[0].m_floats[1];
  fVar23 = (transform->m_basis).m_el[1].m_floats[1];
  fVar20 = (transform->m_origin).m_floats[1];
  fVar19 = (transform->m_origin).m_floats[2];
  fVar22 = (transform->m_basis).m_el[2].m_floats[1];
  auVar18 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar21)),ZEXT416((uint)fVar7),auVar18);
  auVar13 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar23)),ZEXT416((uint)fVar7),auVar13);
  auVar17 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar10),auVar17);
  auVar27 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar16 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)fVar10),auVar27);
  auVar26 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar15 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar9 * fVar22)),auVar26,ZEXT416((uint)fVar7));
  auVar14 = ZEXT416((uint)(transform->m_origin).m_floats[0]);
  auVar12 = vaddss_avx512f(auVar12,auVar14);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)(fVar20 + auVar16._0_4_)),0x10);
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar16 = vfmadd231ss_avx512f(auVar15,auVar25,ZEXT416((uint)fVar10));
  local_38 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar16._0_4_ + fVar19)),0x28);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar21)),ZEXT416((uint)fVar2),auVar18);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar23)),ZEXT416((uint)fVar2),auVar13);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar1),auVar17);
  auVar15 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * fVar22)),ZEXT416((uint)fVar2),auVar26);
  auVar16 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)fVar1),auVar27);
  auVar12 = vaddss_avx512f(auVar12,auVar14);
  auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar1),auVar25);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)(fVar20 + auVar16._0_4_)),0x10);
  local_48 = vinsertps_avx(auVar12,ZEXT416((uint)(fVar19 + auVar15._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_38,local_48,color);
  return;
}

Assistant:

virtual void drawPlane(const cbtVector3& planeNormal, cbtScalar planeConst, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 planeOrigin = planeNormal * planeConst;
		cbtVector3 vec0, vec1;
		cbtPlaneSpace1(planeNormal, vec0, vec1);
		cbtScalar vecLen = 100.f;
		cbtVector3 pt0 = planeOrigin + vec0 * vecLen;
		cbtVector3 pt1 = planeOrigin - vec0 * vecLen;
		cbtVector3 pt2 = planeOrigin + vec1 * vecLen;
		cbtVector3 pt3 = planeOrigin - vec1 * vecLen;
		drawLine(transform * pt0, transform * pt1, color);
		drawLine(transform * pt2, transform * pt3, color);
	}